

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O3

void __thiscall
Js::JavascriptPromiseResolveThenableTaskFunction::JavascriptPromiseResolveThenableTaskFunction
          (JavascriptPromiseResolveThenableTaskFunction *this,DynamicType *type,
          FunctionInfo *functionInfo,JavascriptPromise *promise,RecyclableObject *thenable,
          RecyclableObject *thenFunction)

{
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_0152e7b0;
  Memory::Recycler::WBSetBit((char *)&this->promise);
  (this->promise).ptr = promise;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->promise);
  Memory::Recycler::WBSetBit((char *)&this->thenable);
  (this->thenable).ptr = thenable;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->thenable);
  Memory::Recycler::WBSetBit((char *)&this->thenFunction);
  (this->thenFunction).ptr = thenFunction;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->thenFunction);
  return;
}

Assistant:

JavascriptPromiseResolveThenableTaskFunction(DynamicType* type, FunctionInfo* functionInfo, JavascriptPromise* promise, RecyclableObject* thenable, RecyclableObject* thenFunction)
            : RuntimeFunction(type, functionInfo), promise(promise), thenable(thenable), thenFunction(thenFunction)
        { }